

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprAliasDefinition * AnalyzeTypedef(ExpressionContext *ctx,SynTypedef *syntax)

{
  ScopeData *pSVar1;
  uint uVar2;
  int iVar3;
  TypeBase *pTVar4;
  undefined4 extraout_var;
  SynIdentifier *this;
  ExprAliasDefinition *pEVar5;
  char *msg;
  InplaceStr IVar6;
  AliasData *alias;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  uVar2 = NULLC::GetStringHash((syntax->alias->name).begin,(syntax->alias->name).end);
  pTVar4 = anon_unknown.dwarf_9c70f::LookupTypeByName
                     ((anon_unknown_dwarf_9c70f *)ctx->scope,
                      (ExpressionContext *)ctx->lookupLocation,uVar2);
  if (pTVar4 == (TypeBase *)0x0) {
    pTVar4 = AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
    if (pTVar4 != ctx->typeAuto) {
      IVar6 = GetTypeNameInScope(ctx,ctx->scope,syntax->alias->name);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      alias = (AliasData *)CONCAT44(extraout_var,iVar3);
      pSVar1 = ctx->scope;
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar3);
      SynBase::SynBase((SynBase *)this,4,(syntax->alias->super_SynBase).begin,
                       (syntax->alias->super_SynBase).end);
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      this->name = IVar6;
      uVar2 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar2 + 1;
      alias->source = &syntax->super_SynBase;
      alias->scope = pSVar1;
      alias->type = pTVar4;
      alias->name = this;
      alias->uniqueId = uVar2;
      alias->importModule = (ModuleData *)0x0;
      uVar2 = NULLC::GetStringHash(IVar6.begin,IVar6.end);
      alias->nameHash = uVar2;
      ExpressionContext::AddAlias(ctx,alias);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar5 = (ExprAliasDefinition *)CONCAT44(extraout_var_01,iVar3);
      pTVar4 = ctx->typeVoid;
      (pEVar5->super_ExprBase).typeID = 0x2a;
      (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
      (pEVar5->super_ExprBase).type = pTVar4;
      (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar5->super_ExprBase).listed = false;
      (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00224270;
      pEVar5->alias = alias;
      return pEVar5;
    }
    msg = "ERROR: can\'t alias \'auto\' type";
  }
  else {
    msg = "ERROR: there is already a type or an alias with the same name";
  }
  anon_unknown.dwarf_9c70f::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprAliasDefinition* AnalyzeTypedef(ExpressionContext &ctx, SynTypedef *syntax)
{
	if(LookupTypeByName(ctx, syntax->alias->name.hash()))
		Stop(ctx, syntax, "ERROR: there is already a type or an alias with the same name");

	TypeBase *type = AnalyzeType(ctx, syntax->type);

	if(type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: can't alias 'auto' type");

	InplaceStr aliasName = GetTypeNameInScope(ctx, ctx.scope, syntax->alias->name);

	AliasData *alias = new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, type, new (ctx.get<SynIdentifier>()) SynIdentifier(syntax->alias, aliasName), ctx.uniqueAliasId++);

	ctx.AddAlias(alias);

	return new (ctx.get<ExprAliasDefinition>()) ExprAliasDefinition(syntax, ctx.typeVoid, alias);
}